

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  int iVar1;
  bool bVar2;
  UVector *items_1;
  int local_68;
  int32_t gmtPatType_1;
  int32_t patidx_1;
  int32_t tmpS;
  int32_t tmpM;
  int32_t tmpH;
  int32_t tmpSign;
  int32_t tmpLen;
  UVector *items;
  int32_t gmtPatType;
  int32_t patidx;
  int32_t offsetS;
  int32_t offsetM;
  int32_t offsetH;
  int32_t sign;
  int32_t offset;
  int32_t outLen;
  int32_t *parsedLen_local;
  UBool param_3_local;
  UnicodeString *pUStack_18;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  sign = 0;
  offsetH = 0;
  offsetM = 1;
  *parsedLen = 0;
  gmtPatType = 0;
  patidx = 0;
  offsetS = 0;
  items._4_4_ = 0;
  _offset = parsedLen;
  parsedLen_local._3_1_ = param_3;
  parsedLen_local._4_4_ = start;
  pUStack_18 = text;
  text_local = (UnicodeString *)this;
  while (-1 < *(int *)(PARSE_GMT_OFFSET_TYPES + (long)items._4_4_ * 4)) {
    items._0_4_ = *(int *)(PARSE_GMT_OFFSET_TYPES + (long)items._4_4_ * 4);
    _tmpSign = this->fGMTOffsetPatternItems[(int)items];
    sign = parseOffsetFieldsWithPattern
                     (this,pUStack_18,parsedLen_local._4_4_,_tmpSign,'\0',&offsetS,&patidx,
                      &gmtPatType);
    if (0 < sign) {
      bVar2 = true;
      if (((int)items != 4) && (bVar2 = true, (int)items != 0)) {
        bVar2 = (int)items == 1;
      }
      offsetM = -1;
      if (bVar2) {
        offsetM = 1;
      }
      break;
    }
    items._4_4_ = items._4_4_ + 1;
  }
  if ((0 < sign) && (this->fAbuttingOffsetHoursAndMinutes != '\0')) {
    tmpH = 0;
    tmpM = 1;
    tmpS = 0;
    patidx_1 = 0;
    gmtPatType_1 = 0;
    local_68 = 0;
    while (-1 < *(int *)(PARSE_GMT_OFFSET_TYPES + (long)local_68 * 4)) {
      iVar1 = *(int *)(PARSE_GMT_OFFSET_TYPES + (long)local_68 * 4);
      tmpH = parseOffsetFieldsWithPattern
                       (this,pUStack_18,parsedLen_local._4_4_,this->fGMTOffsetPatternItems[iVar1],
                        '\x01',&tmpS,&patidx_1,&gmtPatType_1);
      if (0 < tmpH) {
        bVar2 = true;
        if ((iVar1 != 4) && (bVar2 = true, iVar1 != 0)) {
          bVar2 = iVar1 == 1;
        }
        tmpM = -1;
        if (bVar2) {
          tmpM = 1;
        }
        break;
      }
      local_68 = local_68 + 1;
    }
    if (sign < tmpH) {
      sign = tmpH;
      offsetM = tmpM;
      offsetS = tmpS;
      patidx = patidx_1;
      gmtPatType = gmtPatType_1;
    }
  }
  if (0 < sign) {
    offsetH = ((offsetS * 0x3c + patidx) * 0x3c + gmtPatType) * 1000 * offsetM;
    *_offset = sign;
  }
  return offsetH;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFields(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t outLen = 0;
    int32_t offset = 0;
    int32_t sign = 1;

    parsedLen = 0;

    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;

    for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
        int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
        UVector* items = fGMTOffsetPatternItems[gmtPatType];
        U_ASSERT(items != NULL);

        outLen = parseOffsetFieldsWithPattern(text, start, items, FALSE, offsetH, offsetM, offsetS);
        if (outLen > 0) {
            sign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                1 : -1;
            break;
        }
    }

    if (outLen > 0 && fAbuttingOffsetHoursAndMinutes) {
        // When hours field is sabutting minutes field,
        // the parse result above may not be appropriate.
        // For example, "01020" is parsed as 01:02: above,
        // but it should be parsed as 00:10:20.
        int32_t tmpLen = 0;
        int32_t tmpSign = 1;
        int32_t tmpH = 0;
        int32_t tmpM = 0;
        int32_t tmpS = 0;

        for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
            int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
            UVector* items = fGMTOffsetPatternItems[gmtPatType];
            U_ASSERT(items != NULL);

            // forcing parse to use single hour digit
            tmpLen = parseOffsetFieldsWithPattern(text, start, items, TRUE, tmpH, tmpM, tmpS);
            if (tmpLen > 0) {
                tmpSign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                    1 : -1;
                break;
            }
        }
        if (tmpLen > outLen) {
            // Better parse result with single hour digit
            outLen = tmpLen;
            sign = tmpSign;
            offsetH = tmpH;
            offsetM = tmpM;
            offsetS = tmpS;
        }
    }

    if (outLen > 0) {
        offset = ((((offsetH * 60) + offsetM) * 60) + offsetS) * 1000 * sign;
        parsedLen = outLen;
    }

    return offset;
}